

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderApiTests.cpp
# Opt level: O3

IterateResult __thiscall
deqp::gles3::Functional::ProgramBinaryCase::iterate(ProgramBinaryCase *this)

{
  ostringstream *this_00;
  TestContext *this_01;
  undefined1 local_190 [120];
  ios_base local_118 [264];
  
  this_01 = (this->super_TestCase).super_TestCase.super_TestNode.m_testCtx;
  if ((this->m_formats).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start ==
      (this->m_formats).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    local_190._0_8_ = this_01->m_log;
    this_00 = (ostringstream *)(local_190 + 8);
    std::__cxx11::ostringstream::ostringstream(this_00);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)this_00,"No program binary formats are supported.",0x28);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_190,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(this_00);
    std::ios_base::~ios_base(local_118);
    tcu::TestContext::setTestResult
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
               QP_TEST_RESULT_NOT_SUPPORTED,"Not supported");
  }
  else {
    tcu::TestContext::setTestResult(this_01,QP_TEST_RESULT_PASS,"Pass");
    (this->super_CallLogWrapper).m_enableLog = true;
    (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[5])(this);
  }
  return STOP;
}

Assistant:

tcu::TestNode::IterateResult ProgramBinaryCase::iterate (void)
{
	TestLog&	log	= m_testCtx.getLog();

	if (m_formats.empty())
	{
		log << TestLog::Message << "No program binary formats are supported." << TestLog::EndMessage;

		m_testCtx.setTestResult(QP_TEST_RESULT_NOT_SUPPORTED, "Not supported");
	}
	else
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");

		enableLogging(true);
		test();
	}

	return STOP;
}